

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mmu.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2f8484::MmuTest_set_membanks_Test::~MmuTest_set_membanks_Test
          (MmuTest_set_membanks_Test *this)

{
  MmuTest::~MmuTest(&this->super_MmuTest);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(MmuTest, set_membanks) {
    auto mem_bank = std::make_unique<MockMemBank>();

    EXPECT_CALL(*mem_bank, write_byte(1234u, 42u));
    EXPECT_CALL(*mem_bank, is_address_in_range(1234u))
            .WillOnce(testing::Return(true));

    MemBankList mem_banks;
    mem_banks.emplace_back(std::move(mem_bank));
    mmu->set_mem_banks(std::move(mem_banks));

    mmu->write_byte(1234u, 42u);
}